

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example2_SubSystem_SubSystemB_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  char *pcVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar2 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar2 = (long)buf[6] << 8;
    case 6:
      uVar2 = uVar2 | (long)buf[5] << 0x10;
    case 5:
      uVar2 = uVar2 | (long)buf[4] << 0x18;
    case 4:
      uVar2 = uVar2 | (long)buf[3] << 0x20;
    case 3:
      uVar2 = uVar2 | (long)buf[2] << 0x28;
    case 2:
      uVar2 = uVar2 | (long)buf[1] << 0x30;
    case 1:
      uVar2 = (ulong)(byte)*buf << 0x38 | uVar2;
      break;
    default:
      goto switchD_0010f54e_default;
    }
  }
  else {
    uVar2 = *(ulong *)buf;
    uVar2 = (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  if (uVar2 == 0x537472616e676500) {
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 1;
  }
  else {
    if ((int)(uVar2 >> 0x20) != 0x4e4f4e45) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 0;
  }
  *value = uVar3;
  *value_sign = 0;
  buf = pcVar1;
switchD_0010f54e_default:
  return buf;
}

Assistant:

static const char *MyGame_Example2_SubSystem_SubSystemB_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if ((w & 0xffffffffffffff00) == 0x537472616e676500) { /* "Strange" */
        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
        if (buf != mark) {
            *value = UINT64_C(1), *value_sign = 0;
        } else {
            return unmatched;
        }
    } else { /* "Strange" */
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "NONE" */
            return unmatched;
        } /* "NONE" */
    } /* "Strange" */
    return buf;
}